

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track-heuristic-partition-matching.cxx
# Opt level: O0

Parameters * parseCommandLine(int argc,char **argv)

{
  double dVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  double *pdVar4;
  unsigned_long *puVar5;
  runtime_error *prVar6;
  ostream *poVar7;
  void *pvVar8;
  char *pcVar9;
  Parameters *in_RDI;
  double dVar10;
  ArgException *e;
  SwitchArg argBifurcationConstraint;
  ValueArg<unsigned_long> argMaxDistance;
  ValueArg<double> argBirthCost;
  ValueArg<double> argTerminationCost;
  ValueArg<double> argBiasTemporal;
  ValueArg<double> argBiasSpatial;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argSolutionName;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argEdgesFileName;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  argNodesFileName;
  CmdLine tclap;
  Parameters *parameters;
  Parameters *in_stack_ffffffffffffedc0;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  unsigned_long in_stack_ffffffffffffedd8;
  undefined1 default_val;
  string *in_stack_ffffffffffffede0;
  string *in_stack_ffffffffffffede8;
  string *in_stack_ffffffffffffedf0;
  string *in_stack_ffffffffffffedf8;
  ValueArg<unsigned_long> *in_stack_ffffffffffffee00;
  string *in_stack_ffffffffffffee08;
  ValueArg<double> *in_stack_ffffffffffffee10;
  string *in_stack_ffffffffffffee18;
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffee20;
  string *in_stack_ffffffffffffee28;
  int argc_00;
  CmdLine *in_stack_ffffffffffffee30;
  string *in_stack_ffffffffffffee38;
  CmdLine *in_stack_ffffffffffffee40;
  allocator<char> local_f69;
  string local_f68 [39];
  allocator<char> local_f41;
  string local_f40 [39];
  allocator<char> local_f19;
  string local_f18 [32];
  SwitchArg local_ef8;
  allocator<char> local_e49;
  string local_e48 [39];
  allocator<char> local_e21;
  string local_e20 [39];
  allocator<char> local_df9;
  string local_df8 [39];
  allocator<char> local_dd1;
  string local_dd0 [32];
  ValueArg<unsigned_long> local_db0;
  allocator<char> local_cc9;
  string local_cc8 [39];
  allocator<char> local_ca1;
  string local_ca0 [39];
  allocator<char> local_c79;
  string local_c78 [39];
  allocator<char> local_c51;
  string local_c50 [32];
  ValueArg<double> local_c30;
  allocator<char> local_b49;
  string local_b48 [39];
  allocator<char> local_b21;
  string local_b20 [39];
  allocator<char> local_af9;
  string local_af8 [39];
  allocator<char> local_ad1;
  string local_ad0 [32];
  ValueArg<double> local_ab0;
  allocator<char> local_9c9;
  string local_9c8 [39];
  allocator<char> local_9a1;
  string local_9a0 [39];
  allocator<char> local_979;
  string local_978 [39];
  allocator<char> local_951;
  string local_950 [32];
  ValueArg<double> local_930;
  allocator<char> local_849;
  string local_848 [39];
  allocator<char> local_821;
  string local_820 [39];
  allocator<char> local_7f9;
  string local_7f8 [39];
  allocator<char> local_7d1;
  string local_7d0 [32];
  ValueArg<double> local_7b0;
  allocator<char> local_6c9;
  string local_6c8 [32];
  string local_6a8 [39];
  allocator<char> local_681;
  string local_680 [39];
  allocator<char> local_659;
  string local_658 [39];
  allocator<char> local_631;
  string local_630 [32];
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_610;
  allocator<char> local_4f9;
  string local_4f8 [32];
  string local_4d8 [39];
  allocator<char> local_4b1;
  string local_4b0 [39];
  allocator<char> local_489;
  string local_488 [39];
  allocator<char> local_461;
  string local_460 [32];
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_440;
  allocator<char> local_329;
  string local_328 [32];
  string local_308 [39];
  allocator<char> local_2e1;
  string local_2e0 [39];
  allocator<char> local_2b9;
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290 [32];
  ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  allocator<char> local_159;
  string local_158 [55];
  allocator<char> local_121;
  string local_120 [32];
  undefined1 local_19;
  
  local_19 = '\0';
  Parameters::Parameters(in_stack_ffffffffffffedc0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  TCLAP::CmdLine::CmdLine
            (in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,
             (char)((ulong)in_stack_ffffffffffffee30 >> 0x38),in_stack_ffffffffffffee28,
             SUB81((ulong)in_stack_ffffffffffffee20 >> 0x38,0));
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::__cxx11::string::string(local_308,(string *)&in_RDI->nodesFileName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,(string *)in_stack_ffffffffffffee10
             ,in_stack_ffffffffffffee08,SUB81((ulong)in_stack_ffffffffffffee00 >> 0x38,0),
             in_stack_ffffffffffffedf8,(string *)in_stack_ffffffffffffee30,
             (CmdLineInterface *)in_stack_ffffffffffffee38,(Visitor *)in_stack_ffffffffffffee40);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator(&local_329);
  std::__cxx11::string::~string(local_308);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator(&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::__cxx11::string::string(local_4d8,(string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,(string *)in_stack_ffffffffffffee10
             ,in_stack_ffffffffffffee08,SUB81((ulong)in_stack_ffffffffffffee00 >> 0x38,0),
             in_stack_ffffffffffffedf8,(string *)in_stack_ffffffffffffee30,
             (CmdLineInterface *)in_stack_ffffffffffffee38,(Visitor *)in_stack_ffffffffffffee40);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  std::__cxx11::string::~string(local_4d8);
  std::__cxx11::string::~string(local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator(&local_489);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::__cxx11::string::string(local_6a8,(string *)&in_RDI->solutionName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  TCLAP::ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ValueArg(in_stack_ffffffffffffee20,in_stack_ffffffffffffee18,(string *)in_stack_ffffffffffffee10
             ,in_stack_ffffffffffffee08,SUB81((ulong)in_stack_ffffffffffffee00 >> 0x38,0),
             in_stack_ffffffffffffedf8,(string *)in_stack_ffffffffffffee30,
             (CmdLineInterface *)in_stack_ffffffffffffee38,(Visitor *)in_stack_ffffffffffffee40);
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator(&local_6c9);
  std::__cxx11::string::~string(local_6a8);
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator(&local_681);
  std::__cxx11::string::~string(local_658);
  std::allocator<char>::~allocator(&local_659);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator(&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  TCLAP::ValueArg<double>::ValueArg
            (in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,(string *)in_stack_ffffffffffffee00
             ,in_stack_ffffffffffffedf8,SUB81((ulong)in_stack_ffffffffffffedf0 >> 0x38,0),
             (double)in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,
             (CmdLineInterface *)in_stack_ffffffffffffee20,(Visitor *)in_stack_ffffffffffffee28);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::~allocator(&local_849);
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator(&local_821);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator(&local_7d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  TCLAP::ValueArg<double>::ValueArg
            (in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,(string *)in_stack_ffffffffffffee00
             ,in_stack_ffffffffffffedf8,SUB81((ulong)in_stack_ffffffffffffedf0 >> 0x38,0),
             (double)in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,
             (CmdLineInterface *)in_stack_ffffffffffffee20,(Visitor *)in_stack_ffffffffffffee28);
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator(&local_9c9);
  std::__cxx11::string::~string(local_9a0);
  std::allocator<char>::~allocator(&local_9a1);
  std::__cxx11::string::~string(local_978);
  std::allocator<char>::~allocator(&local_979);
  std::__cxx11::string::~string(local_950);
  std::allocator<char>::~allocator(&local_951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  TCLAP::ValueArg<double>::ValueArg
            (in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,(string *)in_stack_ffffffffffffee00
             ,in_stack_ffffffffffffedf8,SUB81((ulong)in_stack_ffffffffffffedf0 >> 0x38,0),
             (double)in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,
             (CmdLineInterface *)in_stack_ffffffffffffee20,(Visitor *)in_stack_ffffffffffffee28);
  std::__cxx11::string::~string(local_b48);
  std::allocator<char>::~allocator(&local_b49);
  std::__cxx11::string::~string(local_b20);
  std::allocator<char>::~allocator(&local_b21);
  std::__cxx11::string::~string(local_af8);
  std::allocator<char>::~allocator(&local_af9);
  std::__cxx11::string::~string(local_ad0);
  std::allocator<char>::~allocator(&local_ad1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  TCLAP::ValueArg<double>::ValueArg
            (in_stack_ffffffffffffee10,in_stack_ffffffffffffee08,(string *)in_stack_ffffffffffffee00
             ,in_stack_ffffffffffffedf8,SUB81((ulong)in_stack_ffffffffffffedf0 >> 0x38,0),
             (double)in_stack_ffffffffffffede8,in_stack_ffffffffffffede0,
             (CmdLineInterface *)in_stack_ffffffffffffee20,(Visitor *)in_stack_ffffffffffffee28);
  argc_00 = (int)((ulong)in_stack_ffffffffffffee28 >> 0x20);
  std::__cxx11::string::~string(local_cc8);
  std::allocator<char>::~allocator(&local_cc9);
  std::__cxx11::string::~string(local_ca0);
  std::allocator<char>::~allocator(&local_ca1);
  std::__cxx11::string::~string(local_c78);
  std::allocator<char>::~allocator(&local_c79);
  std::__cxx11::string::~string(local_c50);
  std::allocator<char>::~allocator(&local_c51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  this = (ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&stack0xffffffffffffff00;
  TCLAP::ValueArg<unsigned_long>::ValueArg
            (in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,
             in_stack_ffffffffffffede8,SUB81((ulong)in_stack_ffffffffffffede0 >> 0x38,0),
             in_stack_ffffffffffffedd8,(string *)in_stack_ffffffffffffee10,
             (CmdLineInterface *)in_stack_ffffffffffffee18,(Visitor *)in_stack_ffffffffffffee20);
  default_val = (undefined1)(in_stack_ffffffffffffedd8 >> 0x38);
  std::__cxx11::string::~string(local_e48);
  std::allocator<char>::~allocator(&local_e49);
  std::__cxx11::string::~string(local_e20);
  std::allocator<char>::~allocator(&local_e21);
  std::__cxx11::string::~string(local_df8);
  std::allocator<char>::~allocator(&local_df9);
  std::__cxx11::string::~string(local_dd0);
  std::allocator<char>::~allocator(&local_dd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffee00,(char *)in_stack_ffffffffffffedf8,
             (allocator<char> *)in_stack_ffffffffffffedf0);
  TCLAP::SwitchArg::SwitchArg
            ((SwitchArg *)in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8,
             in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,
             (CmdLineInterface *)in_stack_ffffffffffffede0,(bool)default_val,
             (Visitor *)in_stack_ffffffffffffee10);
  std::__cxx11::string::~string(local_f68);
  std::allocator<char>::~allocator(&local_f69);
  std::__cxx11::string::~string(local_f40);
  std::allocator<char>::~allocator(&local_f41);
  std::__cxx11::string::~string(local_f18);
  std::allocator<char>::~allocator(&local_f19);
  TCLAP::CmdLine::parse(in_stack_ffffffffffffee30,argc_00,(char **)in_stack_ffffffffffffee20);
  pbVar3 = TCLAP::
           ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::getValue(&local_440);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)pbVar3);
  pbVar3 = TCLAP::
           ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::getValue(&local_270);
  std::__cxx11::string::operator=((string *)&in_RDI->nodesFileName,(string *)pbVar3);
  pbVar3 = TCLAP::
           ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::getValue(&local_610);
  std::__cxx11::string::operator=((string *)&in_RDI->solutionName,(string *)pbVar3);
  pdVar4 = TCLAP::ValueArg<double>::getValue(&local_7b0);
  in_RDI->biasSpatial = *pdVar4;
  pdVar4 = TCLAP::ValueArg<double>::getValue(&local_930);
  in_RDI->biasTemporal = *pdVar4;
  pdVar4 = TCLAP::ValueArg<double>::getValue(&local_ab0);
  in_RDI->terminationCost = *pdVar4;
  pdVar4 = TCLAP::ValueArg<double>::getValue(&local_c30);
  in_RDI->birthCost = *pdVar4;
  puVar5 = TCLAP::ValueArg<unsigned_long>::getValue(&local_db0);
  in_RDI->maxDistance = *puVar5;
  bVar2 = TCLAP::SwitchArg::getValue(&local_ef8);
  in_RDI->bifurcationConstraint = bVar2;
  dVar1 = in_RDI->biasSpatial;
  dVar10 = std::numeric_limits<double>::epsilon();
  if (dVar10 <= dVar1) {
    dVar1 = in_RDI->biasSpatial;
    dVar10 = std::numeric_limits<double>::epsilon();
    if (dVar1 <= 1.0 - dVar10) {
      dVar1 = in_RDI->biasTemporal;
      dVar10 = std::numeric_limits<double>::epsilon();
      if (dVar10 <= dVar1) {
        dVar1 = in_RDI->biasTemporal;
        dVar10 = std::numeric_limits<double>::epsilon();
        if (dVar1 <= 1.0 - dVar10) {
          poVar7 = std::operator<<((ostream *)&std::cout,"parameters:");
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"- cut prior (spatial) : ");
          pvVar8 = (void *)std::ostream::operator<<(poVar7,in_RDI->biasSpatial);
          poVar7 = (ostream *)
                   std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"- cut prior (temporal): ");
          pvVar8 = (void *)std::ostream::operator<<(poVar7,in_RDI->biasTemporal);
          poVar7 = (ostream *)
                   std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"- cost of termination : ");
          pvVar8 = (void *)std::ostream::operator<<(poVar7,in_RDI->terminationCost);
          poVar7 = (ostream *)
                   std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"- cost of birth: ");
          pvVar8 = (void *)std::ostream::operator<<(poVar7,in_RDI->birthCost);
          poVar7 = (ostream *)
                   std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"- bifurcation constraint: ");
          pcVar9 = "no";
          if ((in_RDI->bifurcationConstraint & 1U) != 0) {
            pcVar9 = "yes";
          }
          poVar7 = std::operator<<(poVar7,pcVar9);
          poVar7 = (ostream *)
                   std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"- locality (max distance): ");
          pvVar8 = (void *)std::ostream::operator<<(poVar7,in_RDI->maxDistance);
          poVar7 = (ostream *)
                   std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
          poVar7 = std::operator<<(poVar7,"- Solver: Hungarian matching");
          pvVar8 = (void *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
          local_19 = 1;
          TCLAP::SwitchArg::~SwitchArg((SwitchArg *)0x18479f);
          TCLAP::ValueArg<unsigned_long>::~ValueArg((ValueArg<unsigned_long> *)this);
          TCLAP::ValueArg<double>::~ValueArg((ValueArg<double> *)this);
          TCLAP::ValueArg<double>::~ValueArg((ValueArg<double> *)this);
          TCLAP::ValueArg<double>::~ValueArg((ValueArg<double> *)this);
          TCLAP::ValueArg<double>::~ValueArg((ValueArg<double> *)this);
          TCLAP::
          ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~ValueArg(this);
          TCLAP::
          ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~ValueArg(this);
          TCLAP::
          ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~ValueArg(this);
          TCLAP::CmdLine::~CmdLine((CmdLine *)this);
          if ((local_19 & 1) == 0) {
            Parameters::~Parameters((Parameters *)this);
          }
          return in_RDI;
        }
      }
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"Temporal bias must be in the range (0, 1)");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar6,"Spatial bias must be in the range (0, 1)");
  __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Parameters
parseCommandLine(int argc, char** argv) try {
    Parameters parameters;

    TCLAP::CmdLine tclap("track", ' ', "1.0");
    TCLAP::ValueArg<std::string> argNodesFileName(
        "n", "nodes-file", "nodes information", true, parameters.nodesFileName,
        "nodes-file", tclap);
    TCLAP::ValueArg<std::string> argEdgesFileName(
        "e", "edges-file", "edges information", true, parameters.edgesFileName,
        "edges-file", tclap);
    TCLAP::ValueArg<std::string> argSolutionName(
        "s", "solution-name", "solution name", true, parameters.solutionName,
        "solution-name", tclap);
    TCLAP::ValueArg<double> argBiasSpatial(
        "b", "cut-prior-spatial", "cut prior spatial", false,
        parameters.biasSpatial, "cut prior spatial", tclap);
    TCLAP::ValueArg<double> argBiasTemporal(
        "t", "cut-prior-temporal", "cut prior temporal", false,
        parameters.biasTemporal, "cut prior temporal", tclap);
    TCLAP::ValueArg<double> argTerminationCost(
        "T", "termination-cost", "early termination cost", false,
        parameters.terminationCost, "early termination cost", tclap);
    TCLAP::ValueArg<double> argBirthCost("B", "birth-cost", "birth cost", false,
                                         parameters.birthCost, "birth cost",
                                         tclap);
    TCLAP::ValueArg<size_t> argMaxDistance("L", "max-dist", "maximum distance",
                                           false, parameters.maxDistance,
                                           "max dist", tclap);
    TCLAP::SwitchArg argBifurcationConstraint(
        "F", "bifurcation-constraint",
        "Enforce bifurcation contraint. (Default: disabled).", tclap);

    tclap.parse(argc, argv);

    parameters.edgesFileName = argEdgesFileName.getValue();
    parameters.nodesFileName = argNodesFileName.getValue();
    parameters.solutionName = argSolutionName.getValue();
    parameters.biasSpatial = argBiasSpatial.getValue();
    parameters.biasTemporal = argBiasTemporal.getValue();
    parameters.terminationCost = argTerminationCost.getValue();
    parameters.birthCost = argBirthCost.getValue();
    parameters.maxDistance = argMaxDistance.getValue();
    parameters.bifurcationConstraint = argBifurcationConstraint.getValue();

    if (parameters.biasSpatial < std::numeric_limits<double>::epsilon() ||
        parameters.biasSpatial > 1.0 - std::numeric_limits<double>::epsilon())
        throw std::runtime_error("Spatial bias must be in the range (0, 1)");

    if (parameters.biasTemporal < std::numeric_limits<double>::epsilon() ||
        parameters.biasTemporal > 1.0 - std::numeric_limits<double>::epsilon())
        throw std::runtime_error("Temporal bias must be in the range (0, 1)");

    std::cout << "parameters:" << std::endl
              << "- cut prior (spatial) : " << parameters.biasSpatial
              << std::endl
              << "- cut prior (temporal): " << parameters.biasTemporal
              << std::endl
              << "- cost of termination : " << parameters.terminationCost
              << std::endl
              << "- cost of birth: " << parameters.birthCost << std::endl
              << "- bifurcation constraint: "
              << (parameters.bifurcationConstraint ? "yes" : "no") << std::endl
              << "- locality (max distance): " << parameters.maxDistance
              << std::endl
              << "- Solver: Hungarian matching" << std::endl
              << std::endl;

    return parameters;
} catch (TCLAP::ArgException& e) {
    throw std::runtime_error(e.error());
}